

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomCustomWidget::~DomCustomWidget(DomCustomWidget *this)

{
  DomHeader *this_00;
  DomSlots *this_01;
  DomPropertySpecifications *this_02;
  
  this_00 = this->m_header;
  if (this_00 != (DomHeader *)0x0) {
    DomHeader::~DomHeader(this_00);
  }
  operator_delete(this_00,0x38);
  operator_delete(this->m_sizeHint,0xc);
  this_01 = this->m_slots;
  if (this_01 != (DomSlots *)0x0) {
    DomSlots::~DomSlots(this_01);
  }
  operator_delete(this_01,0x38);
  this_02 = this->m_propertyspecifications;
  if (this_02 != (DomPropertySpecifications *)0x0) {
    DomPropertySpecifications::~DomPropertySpecifications(this_02);
  }
  operator_delete(this_02,0x38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_pixmap).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_addPageMethod).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_extends).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_class).d);
  return;
}

Assistant:

DomCustomWidget::~DomCustomWidget()
{
    delete m_header;
    delete m_sizeHint;
    delete m_slots;
    delete m_propertyspecifications;
}